

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

void __thiscall
despot::HierarchyCPT::SetParents
          (HierarchyCPT *this,int val,
          vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *parents)

{
  NamedVar *child;
  TabularCPT *this_00;
  reference ppTVar1;
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> local_38;
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *local_20;
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *parents_local;
  HierarchyCPT *pHStack_10;
  int val_local;
  HierarchyCPT *this_local;
  
  local_20 = parents;
  parents_local._4_4_ = val;
  pHStack_10 = this;
  this_00 = (TabularCPT *)operator_new(0x70);
  child = (this->super_CPT).super_Function.child_;
  std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::vector(&local_38,parents);
  TabularCPT::TabularCPT(this_00,child,&local_38);
  ppTVar1 = std::vector<despot::TabularCPT_*,_std::allocator<despot::TabularCPT_*>_>::operator[]
                      (&this->cpts_,(long)parents_local._4_4_);
  *ppTVar1 = this_00;
  std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::~vector(&local_38);
  return;
}

Assistant:

void HierarchyCPT::SetParents(int val, vector<NamedVar*> parents) {
	cpts_[val] = new TabularCPT(child_, parents);
}